

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udataswp.cpp
# Opt level: O0

int32_t uprv_swapArray16(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                        UErrorCode *pErrorCode)

{
  UBool UVar1;
  int local_4c;
  uint16_t x;
  ushort *puStack_48;
  int32_t count;
  uint16_t *q;
  uint16_t *p;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    ds_local._4_4_ = 0;
  }
  else if (((ds == (UDataSwapper *)0x0) ||
           (((inData == (void *)0x0 || (length < 0)) || ((length & 1U) != 0)))) ||
          (outData == (void *)0x0)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    ds_local._4_4_ = 0;
  }
  else {
    puStack_48 = (ushort *)outData;
    q = (uint16_t *)inData;
    for (local_4c = length / 2; ds_local._4_4_ = length, 0 < local_4c; local_4c = local_4c + -1) {
      *puStack_48 = *q << 8 | *q >> 8;
      puStack_48 = puStack_48 + 1;
      q = q + 1;
    }
  }
  return ds_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
uprv_swapArray16(const UDataSwapper *ds,
                 const void *inData, int32_t length, void *outData,
                 UErrorCode *pErrorCode) {
    const uint16_t *p;
    uint16_t *q;
    int32_t count;
    uint16_t x;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<0 || (length&1)!=0 || outData==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* setup and swapping */
    p=(const uint16_t *)inData;
    q=(uint16_t *)outData;
    count=length/2;
    while(count>0) {
        x=*p++;
        *q++=(uint16_t)((x<<8)|(x>>8));
        --count;
    }

    return length;
}